

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O0

DirWatcherGeneric * __thiscall
efsw::DirWatcherGeneric::createDirectory(DirWatcherGeneric *this,string *newdir)

{
  WatcherGeneric *pWVar1;
  FileWatcherImpl *pFVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  bool *pbVar6;
  mapped_type *ppDVar7;
  byte local_242;
  byte local_222;
  allocator local_1d9;
  string local_1d8 [32];
  string local_1b8 [39];
  byte local_191;
  string local_190 [39];
  byte local_169;
  string local_168 [7];
  bool skip;
  FileSystem local_148 [8];
  string link;
  string local_128 [8];
  string curPath;
  undefined1 local_100 [8];
  FileInfo fi;
  string dir;
  string local_98 [8];
  string parentPath;
  DirWatcherGeneric *local_78;
  DirWatcherGeneric *dw;
  string local_60 [32];
  FileSystem local_40 [32];
  string *local_20;
  string *newdir_local;
  DirWatcherGeneric *this_local;
  
  local_20 = newdir;
  newdir_local = (string *)this;
  FileSystem::dirRemoveSlashAtEnd(newdir);
  std::__cxx11::string::string(local_60,(string *)newdir);
  FileSystem::fileNameFromPath(local_40,(string *)local_60);
  std::__cxx11::string::operator=((string *)newdir,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string(local_60);
  local_78 = (DirWatcherGeneric *)0x0;
  std::__cxx11::string::string(local_98,(string *)&this->DirSnap);
  FileSystem::dirAddSlashAtEnd((string *)local_98);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fi.Inode,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  FileSystem::dirAddSlashAtEnd((string *)&fi.Inode);
  FileInfo::FileInfo((FileInfo *)local_100,(string *)&fi.Inode);
  bVar3 = FileInfo::isDirectory((FileInfo *)local_100);
  if (((!bVar3) || (bVar3 = FileInfo::isReadable((FileInfo *)local_100), !bVar3)) ||
     (bVar3 = FileSystem::isRemoteFS((string *)&fi.Inode), bVar3)) {
    this_local = (DirWatcherGeneric *)0x0;
  }
  else {
    std::__cxx11::string::string(local_128);
    std::__cxx11::string::string(local_168,(string *)&fi.Inode);
    FileSystem::getLinkRealPath(local_148,(string *)local_168,(string *)local_128);
    std::__cxx11::string::~string(local_168);
    local_169 = 0;
    bVar3 = std::operator!=("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_148);
    if (bVar3) {
      pbVar6 = FileWatcher::followSymlinks(this->Watch->WatcherImpl->mFileWatcher);
      if ((*pbVar6 & 1U) == 0) {
        local_169 = 1;
      }
      pFVar2 = this->Watch->WatcherImpl;
      local_191 = 0;
      uVar4 = (*pFVar2->_vptr_FileWatcherImpl[10])(pFVar2,local_148);
      local_222 = 1;
      if ((uVar4 & 1) == 0) {
        pWVar1 = this->Watch;
        std::__cxx11::string::string(local_190,(string *)local_148);
        local_191 = 1;
        bVar3 = WatcherGeneric::pathInWatches(pWVar1,(string *)local_190);
        local_222 = 1;
        if (!bVar3) {
          pFVar2 = this->Watch->WatcherImpl;
          iVar5 = (*pFVar2->_vptr_FileWatcherImpl[9])(pFVar2,local_128,local_148);
          local_222 = (byte)iVar5 ^ 0xff;
        }
      }
      if ((local_191 & 1) != 0) {
        std::__cxx11::string::~string(local_190);
      }
      if ((local_222 & 1) == 0) {
        std::__cxx11::string::operator=((string *)&fi.Inode,(string *)local_148);
      }
      else {
        local_169 = 1;
      }
    }
    else {
      pWVar1 = this->Watch;
      std::__cxx11::string::string(local_1b8,(string *)&fi.Inode);
      bVar3 = WatcherGeneric::pathInWatches(pWVar1,(string *)local_1b8);
      local_242 = 1;
      if (!bVar3) {
        pFVar2 = this->Watch->WatcherImpl;
        iVar5 = (*pFVar2->_vptr_FileWatcherImpl[10])(pFVar2,&fi.Inode);
        local_242 = (byte)iVar5;
      }
      std::__cxx11::string::~string(local_1b8);
      if ((local_242 & 1) != 0) {
        local_169 = 1;
      }
    }
    if ((local_169 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"",&local_1d9);
      handleAction(this,newdir,1,(string *)local_1d8);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      local_78 = (DirWatcherGeneric *)operator_new(0xc0);
      DirWatcherGeneric(local_78,this,this->Watch,(string *)&fi.Inode,(bool)(this->Recursive & 1),
                        false);
      addChilds(local_78,true);
      watch(local_78,false);
      ppDVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
                ::operator[](&this->Directories,newdir);
      *ppDVar7 = local_78;
    }
    this_local = local_78;
    std::__cxx11::string::~string((string *)local_148);
    std::__cxx11::string::~string(local_128);
  }
  FileInfo::~FileInfo((FileInfo *)local_100);
  std::__cxx11::string::~string((string *)&fi.Inode);
  std::__cxx11::string::~string(local_98);
  return this_local;
}

Assistant:

DirWatcherGeneric* DirWatcherGeneric::createDirectory( std::string newdir ) {
	FileSystem::dirRemoveSlashAtEnd( newdir );
	newdir = FileSystem::fileNameFromPath( newdir );

	DirWatcherGeneric* dw = NULL;

	/// Check if the directory is a symbolic link
	std::string parentPath( DirSnap.DirectoryInfo.Filepath );
	FileSystem::dirAddSlashAtEnd( parentPath );
	std::string dir( parentPath + newdir );

	FileSystem::dirAddSlashAtEnd( dir );

	FileInfo fi( dir );

	if ( !fi.isDirectory() || !fi.isReadable() || FileSystem::isRemoteFS( dir ) ) {
		return NULL;
	}

	std::string curPath;
	std::string link( FileSystem::getLinkRealPath( dir, curPath ) );
	bool skip = false;

	if ( "" != link ) {
		/// Avoid adding symlinks directories if it's now enabled
		if ( !Watch->WatcherImpl->mFileWatcher->followSymlinks() ) {
			skip = true;
		}

		/// If it's a symlink check if the realpath exists as a watcher, or
		/// if the path is outside the current dir
		if ( Watch->WatcherImpl->pathInWatches( link ) || Watch->pathInWatches( link ) ||
			 !Watch->WatcherImpl->linkAllowed( curPath, link ) ) {
			skip = true;
		} else {
			dir = link;
		}
	} else {
		if ( Watch->pathInWatches( dir ) || Watch->WatcherImpl->pathInWatches( dir ) ) {
			skip = true;
		}
	}

	if ( !skip ) {
		handleAction( newdir, Actions::Add );

		/// Creates the new directory watcher of the subfolder and check for new files
		dw = new DirWatcherGeneric( this, Watch, dir, Recursive );

		dw->addChilds();

		dw->watch();

		/// Add it to the list of directories
		Directories[newdir] = dw;
	}

	return dw;
}